

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5HashClear(Fts5Hash *pHash)

{
  long in_RDI;
  Fts5HashEntry *pSlot;
  Fts5HashEntry *pNext;
  int i;
  undefined8 local_20;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x14); local_c = local_c + 1) {
    local_20 = *(undefined8 **)(*(long *)(in_RDI + 0x20) + (long)local_c * 8);
    while (local_20 != (undefined8 *)0x0) {
      local_20 = (undefined8 *)*local_20;
      sqlite3_free((void *)0x2698bb);
    }
  }
  memset(*(void **)(in_RDI + 0x20),0,(long)*(int *)(in_RDI + 0x14) << 3);
  *(undefined4 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

static void sqlite3Fts5HashClear(Fts5Hash *pHash){
  int i;
  for(i=0; i<pHash->nSlot; i++){
    Fts5HashEntry *pNext;
    Fts5HashEntry *pSlot;
    for(pSlot=pHash->aSlot[i]; pSlot; pSlot=pNext){
      pNext = pSlot->pHashNext;
      sqlite3_free(pSlot);
    }
  }
  memset(pHash->aSlot, 0, pHash->nSlot * sizeof(Fts5HashEntry*));
  pHash->nEntry = 0;
}